

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

void ** ll_register(lua_State *L,char *path)

{
  int iVar1;
  void **tname;
  lua_State *in_RSI;
  lua_State *in_RDI;
  void **plib;
  undefined8 in_stack_ffffffffffffffe8;
  int idx;
  
  idx = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  lua_pushfstring(in_RDI,"LOADLIB: %s",in_RSI);
  lua_gettable(in_RDI,(int)((ulong)in_RSI >> 0x20));
  iVar1 = lua_type(in_RDI,(int)((ulong)in_RSI >> 0x20));
  if (iVar1 == 0) {
    lua_settop(in_RSI,idx);
    tname = (void **)lua_newuserdata((lua_State *)path,CONCAT44(plib._4_4_,plib._0_4_));
    *tname = (void *)0x0;
    luaL_setmetatable(in_RSI,(char *)tname);
    lua_pushfstring(in_RDI,"LOADLIB: %s",in_RSI);
    lua_pushvalue((lua_State *)CONCAT44(plib._4_4_,plib._0_4_),(int)((ulong)in_RDI >> 0x20));
    lua_settable((lua_State *)path,plib._4_4_);
  }
  else {
    tname = (void **)lua_touserdata(in_RSI,idx);
  }
  return tname;
}

Assistant:

static void **ll_register(lua_State *L, const char *path)
{
  void **plib;
  lua_pushfstring(L, "LOADLIB: %s", path);
  lua_gettable(L, LUA_REGISTRYINDEX);  /* check library in registry? */
  if (!lua_isnil(L, -1)) {  /* is there an entry? */
    plib = (void **)lua_touserdata(L, -1);
  } else {  /* no entry yet; create one */
    lua_pop(L, 1);
    plib = (void **)lua_newuserdata(L, sizeof(void *));
    *plib = NULL;
    luaL_setmetatable(L, "_LOADLIB");
    lua_pushfstring(L, "LOADLIB: %s", path);
    lua_pushvalue(L, -2);
    lua_settable(L, LUA_REGISTRYINDEX);
  }
  return plib;
}